

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

string * ScanByChar_abi_cxx11_(string *__return_storage_ptr__,fstream *file)

{
  char cVar1;
  istream *piVar2;
  char c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x18) =
       *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x18) & 0xffffefff;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while( true ) {
      piVar2 = std::operator>>((istream *)file,&c);
      if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) ||
         (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 2) != 0)) break;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    std::fstream::close();
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cout,"Could not find the file\n");
  exit(1);
}

Assistant:

string ScanByChar(fstream &file) {
    string str;
    char c;
    file >> noskipws;//not ignore space
    if (!file.is_open()) {
        cout << "Could not find the file\n";
        exit(EXIT_FAILURE);
    }
    while (file >> c) {  //// if while( !file.eof() ) , will repeat read the char at last
        if (file.eof()) break;
        str += c;
    }
    file.close();
    return str;
}